

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall slang::ast::Compilation::elaborate(Compilation *this)

{
  string_view *psVar1;
  pointer *ppcVar2;
  undefined4 uVar3;
  pointer ppVar4;
  pointer ppCVar5;
  InstanceSymbol *pIVar6;
  InstanceSymbol *pIVar7;
  SourceLocation location;
  pointer ppDVar8;
  DefinitionSymbol *pDVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  RootSymbol *pRVar13;
  Symbol *pSVar14;
  Diagnostic *pDVar15;
  ulong uVar16;
  value_type_pointer pbVar17;
  string_view *psVar18;
  ulong uVar19;
  pointer ppVar20;
  table_element_pointer ppVar21;
  pointer ppCVar22;
  BindDirectiveSyntax *syntax;
  Compilation *this_00;
  Scope *pSVar23;
  Type *pTVar24;
  long lVar25;
  pointer ppDVar26;
  uint uVar27;
  type *key;
  table_element_pointer ppVar28;
  uchar uVar29;
  char cVar30;
  char cVar31;
  byte bVar32;
  undefined1 auVar33 [16];
  SourceRange SVar34;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> sVar35;
  span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports;
  span<const_slang::ast::MethodPrototypeSymbol_*const,_18446744073709551615UL> protos;
  span<const_std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_18446744073709551615UL>
  modports;
  string_view arg;
  LookupLocation location_00;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *__range2;
  vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  newUnreferencedDefs;
  iterator __begin3;
  DiagnosticVisitor elabVisitor;
  undefined1 local_2b8 [24];
  undefined1 local_2a0 [40];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  ResolvedConfig *local_258;
  value_type_pointer local_248;
  value_type_pointer local_240;
  iterator local_238;
  SourceRange local_228;
  uchar local_218;
  char cStack_217;
  char cStack_216;
  byte bStack_215;
  uchar uStack_214;
  char cStack_213;
  char cStack_212;
  byte bStack_211;
  uchar uStack_210;
  char cStack_20f;
  char cStack_20e;
  byte bStack_20d;
  uchar uStack_20c;
  char cStack_20b;
  char cStack_20a;
  byte bStack_209;
  undefined1 local_200 [120];
  byte local_188;
  Type *local_180;
  Type *local_178;
  Type *local_170;
  pointer local_118;
  __extent_storage<18446744073709551615UL> local_110;
  Type *local_d8;
  __extent_storage<18446744073709551615UL> local_d0;
  Type *local_98;
  __extent_storage<18446744073709551615UL> local_90;
  
  uVar27 = (this->options).errorLimit;
  DiagnosticVisitor::DiagnosticVisitor
            ((DiagnosticVisitor *)local_200,this,&this->numErrors,-(uint)(uVar27 == 0) | uVar27);
  pRVar13 = getRoot(this);
  Symbol::visit<slang::ast::DiagnosticVisitor&>
            (&pRVar13->super_Symbol,(DiagnosticVisitor *)local_200);
  if (((ulong)(uint)local_200._16_4_ < (ulong)*(undefined8 *)local_200._8_8_) ||
     ((local_200[0x16] & 1U) != 0)) {
    this->sawFatalError = true;
  }
  else {
    this_00 = (Compilation *)local_200;
    DiagnosticVisitor::finalize((DiagnosticVisitor *)this_00);
    if ((this->dpiExports).
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->dpiExports).
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish || local_110._M_extent_value != 0) {
      dpiImports._M_extent._M_extent_value = local_110._M_extent_value;
      dpiImports._M_ptr = (pointer)local_118;
      this_00 = this;
      checkDPIMethods(this,dpiImports);
    }
    if ((this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->externInterfaceMethods).
        super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::vector((vector<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                *)local_2b8,&this->externInterfaceMethods);
      uVar12 = local_2b8._8_8_;
      for (ppVar21 = (table_element_pointer)local_2b8._0_8_;
          ppVar21 != (table_element_pointer)uVar12;
          ppVar21 = (table_element_pointer)&(ppVar21->first)._M_str) {
        SubroutineSymbol::connectExternInterfacePrototype
                  ((SubroutineSymbol *)(ppVar21->first)._M_len);
      }
      this_00 = (Compilation *)local_2b8;
      std::
      _Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
      ::~_Vector_base((_Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
                       *)this_00);
    }
    if (local_d0._M_extent_value != 0) {
      protos._M_extent._M_extent_value = local_d0._M_extent_value;
      protos._M_ptr = (pointer)local_d8;
      checkExternIfaceMethods(this_00,protos);
    }
    if (local_90._M_extent_value != 0) {
      modports._M_extent._M_extent_value = local_90._M_extent_value;
      modports._M_ptr = (pointer)local_98;
      checkModportExports(this_00,modports);
    }
    ppVar4 = (this->bindDirectives).
             super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar20 = (this->bindDirectives).
                   super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar4;
        ppVar20 = ppVar20 + 1) {
      syntax = ppVar20->first;
      pSVar23 = ppVar20->second;
      local_2b8._8_8_ = 0;
      local_2b8._0_8_ = local_2a0;
      local_2b8._16_8_ = (group_type_pointer)0x5;
      local_268 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_258 = (ResolvedConfig *)0x0;
      resolveBindTargets(this,syntax,pSVar23,(ResolvedBind *)local_2b8);
      checkBindTargetParams(this,syntax,pSVar23,(ResolvedBind *)local_2b8);
      SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)local_2b8,(EVP_PKEY_CTX *)syntax);
    }
    if ((this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->nameConflicts).
        super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::vector
                ((vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_> *)
                 local_2b8,&this->nameConflicts);
      uVar12 = local_2b8._8_8_;
      for (ppVar21 = (table_element_pointer)local_2b8._0_8_;
          ppVar21 != (table_element_pointer)uVar12;
          ppVar21 = (table_element_pointer)&(ppVar21->first)._M_str) {
        pSVar14 = (Symbol *)(ppVar21->first)._M_len;
        Scope::handleNameConflict(pSVar14->parentScope,pSVar14);
      }
      std::_Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>::
      ~_Vector_base((_Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>
                     *)local_2b8);
    }
    if ((this->outOfBlockDecls).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
        .size_ctrl.size != 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)local_2b8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                    *)&this->outOfBlockDecls);
      local_238 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                  ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                           *)local_2b8);
      ppVar28 = local_238.p_;
      while (ppVar28 != (table_element_pointer)0x0) {
        if ((ppVar28->second).
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
            .
            super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
            .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
            super__Head_base<3UL,_bool,_false>._M_head_impl == false) {
          SVar34 = slang::syntax::SyntaxNode::sourceRange
                             ((SyntaxNode *)
                              (((ppVar28->second).
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                .
                                super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                .
                                super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                               ._M_head_impl)->left).ptr);
          pSVar23 = (ppVar28->first).
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .
                    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                    super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
          location_00.index =
               (ppVar28->second).
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .
               super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
               super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
          location_00.scope = pSVar23;
          location_00._12_4_ = 0;
          local_228 = SVar34;
          pSVar14 = Lookup::unqualifiedAt
                              (pSVar23,(ppVar28->first).
                                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .
                                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                       ._M_head_impl,location_00,SVar34,
                               (bitmask<slang::ast::LookupFlags>)0x0);
          if (((pSVar14 != (Symbol *)0x0) &&
              ((ppVar28->first).
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_len != 0)) &&
             ((ppVar28->first).
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
              _M_head_impl._M_len != 0)) {
            if ((pSVar14->kind == GenericClassDef) || (pSVar14->kind == ClassType)) {
              pSVar23 = (ppVar28->first).
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .
                        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                        super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
              SVar34 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)
                                  (ppVar28->second).
                                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                                  .
                                  super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>
                                  ._M_head_impl);
              pDVar15 = Scope::addDiag(pSVar23,(DiagCode)0x1c000d,SVar34);
              pDVar15 = Diagnostic::operator<<
                                  (pDVar15,(ppVar28->first).
                                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           .
                                           super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                           .
                                           super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                           ._M_head_impl);
              Diagnostic::operator<<
                        (pDVar15,(ppVar28->first).
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .
                                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                 ._M_head_impl);
            }
            else {
              pDVar15 = Scope::addDiag((ppVar28->first).
                                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .
                                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                                       super__Head_base<2UL,_const_slang::ast::Scope_*,_false>.
                                       _M_head_impl,(DiagCode)0x1e000a,SVar34);
              Diagnostic::operator<<
                        (pDVar15,(ppVar28->first).
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .
                                 super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                 ._M_head_impl);
            }
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment(&local_238);
        ppVar28 = local_238.p_;
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                     *)local_2b8);
    }
    if ((this->configBlocks).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
        .size_ctrl.size != 0) {
      local_2b8._0_16_ =
           (undefined1  [16])
           boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
           ::begin(&(this->configBlocks).table_);
      while ((table_element_pointer)local_2b8._8_8_ != (table_element_pointer)0x0) {
        ppCVar5 = (((table_element_pointer)local_2b8._8_8_)->second).
                  super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppCVar22 = (((table_element_pointer)local_2b8._8_8_)->second).
                        super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppCVar22 != ppCVar5;
            ppCVar22 = ppCVar22 + 1) {
          if ((*ppCVar22)->isUsed == true) {
            ConfigBlockSymbol::checkUnusedRules(*ppCVar22);
          }
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     *)local_2b8);
      }
    }
    if (((this->options).flags.m_bits & 0x10) == 0) {
      pRVar13 = getRoot(this);
      pbVar17 = (value_type_pointer)(pRVar13->topInstances)._M_ptr;
      local_248 = (value_type_pointer)
                  (&pbVar17->_M_len + (pRVar13->topInstances)._M_extent._M_extent_value);
      while (pbVar17 != local_248) {
        pIVar6 = (InstanceSymbol *)pbVar17->_M_len;
        local_240 = pbVar17;
        sVar35 = InstanceBodySymbol::getPortList(pIVar6->body);
        psVar1 = &(pIVar6->super_InstanceSymbolBase).super_Symbol.name;
        for (lVar25 = 0; sVar35._M_extent._M_extent_value._M_extent_value << 3 != lVar25;
            lVar25 = lVar25 + 8) {
          pIVar7 = *(InstanceSymbol **)((long)sVar35._M_ptr + lVar25);
          if ((pIVar7->super_InstanceSymbolBase).super_Symbol.kind == InterfacePort) {
            pDVar15 = Scope::addDiag(&pIVar6->body->super_Scope,(DiagCode)0x1d000d,
                                     (pIVar7->super_InstanceSymbolBase).super_Symbol.location);
            pDVar15 = Diagnostic::operator<<(pDVar15,*psVar1);
            Diagnostic::operator<<(pDVar15,(pIVar7->super_InstanceSymbolBase).super_Symbol.name);
            break;
          }
          if (*(int *)&pIVar7->body == 3) {
            pSVar23 = &pIVar6->body->super_Scope;
            location = (pIVar7->super_InstanceSymbolBase).super_Symbol.location;
            if ((pIVar7->super_InstanceSymbolBase).super_Symbol.name._M_len == 0) {
              pDVar15 = Scope::addDiag(pSVar23,(DiagCode)0x1f000d,location);
              psVar18 = psVar1;
              pIVar7 = pIVar6;
            }
            else {
              pDVar15 = Scope::addDiag(pSVar23,(DiagCode)0x1e000d,location);
              pDVar15 = Diagnostic::operator<<(pDVar15,*psVar1);
              psVar18 = &(pIVar7->super_InstanceSymbolBase).super_Symbol.name;
            }
            arg._M_str = (pIVar7->super_InstanceSymbolBase).super_Symbol.name._M_str;
            arg._M_len = psVar18->_M_len;
            Diagnostic::operator<<(pDVar15,arg);
          }
        }
        pbVar17 = (value_type_pointer)&local_240->_M_str;
      }
    }
    local_2b8._0_8_ = (Segment *)0x0;
    local_2b8._8_8_ = (byte *)0x0;
    local_2b8._16_8_ = (group_type_pointer)0x0;
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::reserve((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               *)local_2b8,
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppDVar8 = (this->unreferencedDefs).
              super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppDVar26 = (this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppDVar26 != ppDVar8;
        ppDVar26 = ppDVar26 + 1) {
      pDVar9 = *ppDVar26;
      local_238.pc_ = (char_pointer)pDVar9;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pDVar9;
      uVar19 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar16 = uVar19 >> (local_188 & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar19 & 0xff];
      pTVar24 = (Type *)0x0;
      do {
        ppcVar2 = (pointer *)((long)&(local_178->super_Symbol).kind + uVar16 * 2 * 8);
        local_218 = *(uchar *)ppcVar2;
        cStack_217 = *(char *)((long)ppcVar2 + 1);
        cStack_216 = *(char *)((long)ppcVar2 + 2);
        bStack_215 = *(char *)((long)ppcVar2 + 3);
        uStack_214 = *(char *)((long)ppcVar2 + 4);
        cStack_213 = *(char *)((long)ppcVar2 + 5);
        cStack_212 = *(char *)((long)ppcVar2 + 6);
        bStack_211 = *(char *)((long)ppcVar2 + 7);
        uStack_210 = *(uchar *)(ppcVar2 + 1);
        cStack_20f = *(char *)((long)(ppcVar2 + 1) + 1);
        cStack_20e = *(char *)((long)(ppcVar2 + 1) + 2);
        bStack_20d = *(char *)((long)(ppcVar2 + 1) + 3);
        uStack_20c = *(char *)((long)(ppcVar2 + 1) + 4);
        cStack_20b = *(char *)((long)(ppcVar2 + 1) + 5);
        cStack_20a = *(char *)((long)(ppcVar2 + 1) + 6);
        bStack_209 = *(char *)((long)(ppcVar2 + 1) + 7);
        uVar29 = (uchar)uVar3;
        auVar33[0] = -(local_218 == uVar29);
        cVar30 = (char)((uint)uVar3 >> 8);
        auVar33[1] = -(cStack_217 == cVar30);
        cVar31 = (char)((uint)uVar3 >> 0x10);
        auVar33[2] = -(cStack_216 == cVar31);
        bVar32 = (byte)((uint)uVar3 >> 0x18);
        auVar33[3] = -(bStack_215 == bVar32);
        auVar33[4] = -(uStack_214 == uVar29);
        auVar33[5] = -(cStack_213 == cVar30);
        auVar33[6] = -(cStack_212 == cVar31);
        auVar33[7] = -(bStack_211 == bVar32);
        auVar33[8] = -(uStack_210 == uVar29);
        auVar33[9] = -(cStack_20f == cVar30);
        auVar33[10] = -(cStack_20e == cVar31);
        auVar33[0xb] = -(bStack_20d == bVar32);
        auVar33[0xc] = -(uStack_20c == uVar29);
        auVar33[0xd] = -(cStack_20b == cVar30);
        auVar33[0xe] = -(cStack_20a == cVar31);
        auVar33[0xf] = -(bStack_209 == bVar32);
        uVar27 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
        if (uVar27 != 0) {
          do {
            uVar10 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            if (pDVar9 == *(DefinitionSymbol **)
                           ((long)local_170 + (ulong)uVar10 * 8 + uVar16 * 0x78)) goto LAB_001d2eb6;
            uVar27 = uVar27 - 1 & uVar27;
          } while (uVar27 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bStack_209) == 0)
        break;
        pSVar14 = &pTVar24->super_Symbol;
        pTVar24 = (Type *)((long)&(pTVar24->super_Symbol).kind + 1);
        uVar16 = (long)&pSVar14->kind + uVar16 + 1 & (ulong)local_180;
      } while (pTVar24 <= local_180);
      std::
      vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
      ::push_back((vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                   *)local_2b8,(value_type *)&local_238);
LAB_001d2eb6:
    }
    std::
    vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::_M_move_assign(&this->unreferencedDefs,
                     (_Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                      *)local_2b8);
    std::
    _Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
    ::~_Vector_base((_Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                     *)local_2b8);
  }
  DiagnosticVisitor::~DiagnosticVisitor((DiagnosticVisitor *)local_200);
  return;
}

Assistant:

void Compilation::elaborate() {
    SLANG_ASSERT(!isFrozen());

    // Touch every symbol, scope, statement, and expression tree so that
    // we can be sure we have all the diagnostics.
    uint32_t errorLimit = options.errorLimit == 0 ? UINT32_MAX : options.errorLimit;
    DiagnosticVisitor elabVisitor(*this, numErrors, errorLimit);
    getRoot().visit(elabVisitor);

    if (elabVisitor.finishedEarly()) {
        sawFatalError = true;
        return;
    }

    elabVisitor.finalize();

    // Note for the following checks here: anything that depends on a list
    // stored in the compilation object should think carefully about taking
    // a copy of that list first before iterating over it, because your check
    // might trigger additional action that ends up adding to that list,
    // causing undefined behavior.

    // Check all DPI methods for correctness.
    if (!dpiExports.empty() || !elabVisitor.dpiImports.empty())
        checkDPIMethods(elabVisitor.dpiImports);

    // Check extern interface methods for correctness.
    if (!externInterfaceMethods.empty()) {
        auto methods = externInterfaceMethods;
        for (auto method : methods)
            method->connectExternInterfacePrototype();
    }

    if (!elabVisitor.externIfaceProtos.empty())
        checkExternIfaceMethods(elabVisitor.externIfaceProtos);

    if (!elabVisitor.modportsWithExports.empty())
        checkModportExports(elabVisitor.modportsWithExports);

    // Double check any bind directives for correctness. These were already
    // resolved prior to full elaboration but their diagnostics were not
    // issued so we need to check again.
    for (auto [directive, scope] : bindDirectives) {
        ResolvedBind resolvedBind;
        resolveBindTargets(*directive, *scope, resolvedBind);
        checkBindTargetParams(*directive, *scope, resolvedBind);
    }

    // Report any lingering name conflicts.
    if (!nameConflicts.empty()) {
        auto conflicts = nameConflicts;
        for (auto symbol : conflicts) {
            auto scope = symbol->getParentScope();
            SLANG_ASSERT(scope);
            scope->handleNameConflict(*symbol);
        }
    }

    // Report on unused out-of-block definitions. These are always a real error.
    if (!outOfBlockDecls.empty()) {
        auto decls = outOfBlockDecls;
        for (auto& [key, val] : decls) {
            auto& [syntax, name, index, used] = val;
            if (!used) {
                auto& [className, declName, scope] = key;
                auto classRange = name->left->sourceRange();
                auto sym = Lookup::unqualifiedAt(*scope, className,
                                                 LookupLocation(scope, uint32_t(index)),
                                                 classRange);

                if (sym && !declName.empty() && !className.empty()) {
                    if (sym->kind == SymbolKind::ClassType ||
                        sym->kind == SymbolKind::GenericClassDef) {
                        auto& diag = scope->addDiag(diag::NoDeclInClass, name->sourceRange());
                        diag << declName << className;
                    }
                    else {
                        auto& diag = scope->addDiag(diag::NotAClass, classRange);
                        diag << className;
                    }
                }
            }
        }
    }

    // Report on unused config rules.
    if (!configBlocks.empty()) {
        for (auto& [name, confList] : configBlocks) {
            for (auto config : confList) {
                if (config->isUsed)
                    config->checkUnusedRules();
            }
        }
    }

    if (!hasFlag(CompilationFlags::AllowTopLevelIfacePorts)) {
        // Top level instances cannot have interface or ref ports.
        for (auto inst : getRoot().topInstances) {
            for (auto port : inst->body.getPortList()) {
                if (port->kind == SymbolKind::InterfacePort) {
                    inst->body.addDiag(diag::TopModuleIfacePort, port->location)
                        << inst->name << port->name;
                    break;
                }
                else {
                    ArgumentDirection dir;
                    if (port->kind == SymbolKind::MultiPort)
                        dir = port->as<MultiPortSymbol>().direction;
                    else
                        dir = port->as<PortSymbol>().direction;

                    if (dir == ArgumentDirection::Ref) {
                        if (port->name.empty()) {
                            inst->body.addDiag(diag::TopModuleUnnamedRefPort, port->location)
                                << inst->name;
                        }
                        else {
                            inst->body.addDiag(diag::TopModuleRefPort, port->location)
                                << inst->name << port->name;
                        }
                    }
                }
            }
        }
    }

    // Remove definitions from the "unused" set if they were referenced
    // in an interface port somewhere.
    std::vector<const DefinitionSymbol*> newUnreferencedDefs;
    newUnreferencedDefs.reserve(unreferencedDefs.size());
    for (auto def : unreferencedDefs) {
        if (elabVisitor.usedIfacePorts.find(def) == elabVisitor.usedIfacePorts.end())
            newUnreferencedDefs.push_back(def);
    }
    unreferencedDefs = std::move(newUnreferencedDefs);
}